

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observer.cc
# Opt level: O1

CoordTopocentric * __thiscall
libsgp4::Observer::GetLookAngle(CoordTopocentric *__return_storage_ptr__,Observer *this,Eci *eci)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  DateTime local_20;
  
  local_20.m_encoded = (eci->m_dt).m_encoded;
  if (*(long *)(this + 0x18) != local_20.m_encoded) {
    Eci::ToEci((Eci *)(this + 0x18),&local_20,(CoordGeodetic *)this);
  }
  dVar1 = (eci->m_velocity).x;
  dVar2 = (eci->m_velocity).y;
  dVar3 = *(double *)(this + 0x40);
  dVar4 = *(double *)(this + 0x48);
  dVar5 = (eci->m_velocity).z;
  dVar6 = *(double *)(this + 0x50);
  dVar13 = (eci->m_position).x - *(double *)(this + 0x20);
  dVar8 = (eci->m_position).y - *(double *)(this + 0x28);
  dVar16 = (eci->m_position).z - *(double *)(this + 0x30);
  dVar9 = dVar16 * dVar16 + dVar13 * dVar13 + dVar8 * dVar8;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar14 = (double)(eci->m_dt).m_encoded / 86400000000.0 + 1721425.5;
  dVar10 = floor(dVar14 + 0.5);
  dVar15 = (dVar10 + -0.5 + -2451545.0) / 36525.0;
  dVar14 = ((((dVar14 - (dVar10 + -0.5)) * 1.00273790935 * 86400.0 +
             ((dVar15 * -6.2e-06 + 0.093104) * dVar15 + 8640184.812866) * dVar15 + 24110.54841) /
            240.0) * 3.141592653589793) / 180.0;
  dVar10 = floor(dVar14 / 6.283185307179586);
  dVar14 = dVar10 * -6.283185307179586 + dVar14 + *(double *)(this + 8);
  dVar10 = floor(dVar14 / 6.283185307179586);
  dVar14 = dVar10 * -6.283185307179586 + dVar14;
  dVar10 = sin(*(double *)this);
  dVar15 = cos(*(double *)this);
  dVar11 = sin(dVar14);
  dVar14 = cos(dVar14);
  dVar17 = (dVar10 * dVar14 * dVar13 + dVar10 * dVar11 * dVar8) - dVar15 * dVar16;
  dVar12 = atan(-(dVar8 * dVar14 - dVar11 * dVar13) / dVar17);
  uVar7 = -(ulong)(0.0 < dVar17);
  dVar12 = (double)(uVar7 & (ulong)(dVar12 + 3.141592653589793) | ~uVar7 & (ulong)dVar12);
  dVar10 = asin((dVar10 * dVar16 + dVar14 * dVar15 * dVar13 + dVar15 * dVar11 * dVar8) / dVar9);
  __return_storage_ptr__->azimuth =
       (double)(~-(ulong)(dVar12 < 0.0) & (ulong)dVar12 |
               (ulong)(dVar12 + 6.283185307179586) & -(ulong)(dVar12 < 0.0));
  __return_storage_ptr__->elevation = dVar10;
  __return_storage_ptr__->range = dVar9;
  __return_storage_ptr__->range_rate =
       ((dVar5 - dVar6) * dVar16 + (dVar1 - dVar3) * dVar13 + (dVar2 - dVar4) * dVar8) / dVar9;
  return __return_storage_ptr__;
}

Assistant:

CoordTopocentric Observer::GetLookAngle(const Eci &eci)
{
    /*
     * update the observers Eci to match the time of the Eci passed in
     * if necessary
     */
    Update(eci.GetDateTime());

    /*
     * calculate differences
     */
    Vector range_rate = eci.Velocity() - m_eci.Velocity();
    Vector range = eci.Position() - m_eci.Position();

    range.w = range.Magnitude();

    /*
     * Calculate Local Mean Sidereal Time for observers longitude
     */
    double theta = eci.GetDateTime().ToLocalMeanSiderealTime(m_geo.longitude);

    double sin_lat = sin(m_geo.latitude);
    double cos_lat = cos(m_geo.latitude);
    double sin_theta = sin(theta);
    double cos_theta = cos(theta);

    double top_s = sin_lat * cos_theta * range.x
        + sin_lat * sin_theta * range.y - cos_lat * range.z;
    double top_e = -sin_theta * range.x
        + cos_theta * range.y;
    double top_z = cos_lat * cos_theta * range.x 
        + cos_lat * sin_theta * range.y + sin_lat * range.z;
    double az = atan(-top_e / top_s);

    if (top_s > 0.0)
    {
        az += kPI;
    }

    if (az < 0.0)
    {
        az += 2.0 * kPI;
    }

    double el = asin(top_z / range.w);
    double rate = range.Dot(range_rate) / range.w;

    /*
     * azimuth in radians
     * elevation in radians
     * range in km
     * range rate in km/s
     */
    return CoordTopocentric(az,
            el,
            range.w,
            rate);
}